

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::SSLClient::~SSLClient(SSLClient *this)

{
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__SSLClient_001862a8;
  if ((SSL_CTX *)this->ctx_ != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)this->ctx_);
  }
  Client::~Client(&this->super_Client);
  return;
}

Assistant:

inline SSLClient::~SSLClient()
{
    if (ctx_) {
        SSL_CTX_free(ctx_);
    }
}